

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_common.c
# Opt level: O0

LY_ERR lysp_check_date(lysp_ctx *ctx,char *date,size_t date_len,char *stmt)

{
  ushort **ppuVar1;
  char *pcVar2;
  ly_ctx *local_c8;
  ly_ctx *local_c0;
  ly_ctx *local_b8;
  byte local_a9;
  uint8_t i;
  char *r;
  tm tm_;
  tm tm;
  char *stmt_local;
  size_t date_len_local;
  char *date_local;
  lysp_ctx *ctx_local;
  
  if (date == (char *)0x0) {
    if (ctx == (lysp_ctx *)0x0) {
      local_b8 = (ly_ctx *)0x0;
    }
    else {
      local_b8 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    ly_log(local_b8,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","date","lysp_check_date");
  }
  else if (date_len == 10) {
    for (local_a9 = 0; local_a9 < 10; local_a9 = local_a9 + 1) {
      if ((local_a9 == 4) || (local_a9 == 7)) {
        if (date[local_a9] != '-') goto LAB_0019d0d9;
      }
      else {
        ppuVar1 = __ctype_b_loc();
        if (((*ppuVar1)[(int)date[local_a9]] & 0x800) == 0) goto LAB_0019d0d9;
      }
    }
    memset(&tm_.tm_zone,0,0x38);
    pcVar2 = strptime(date,"%Y-%m-%d",(tm *)&tm_.tm_zone);
    if ((pcVar2 != (char *)0x0) && (pcVar2 == date + 10)) {
      memcpy(&r,&tm_.tm_zone,0x38);
      tm_.tm_wday = -1;
      mktime((tm *)&r);
      if (tm.tm_min == tm_.tm_min) {
        return LY_SUCCESS;
      }
    }
LAB_0019d0d9:
    if (stmt != (char *)0x0) {
      if (ctx == (lysp_ctx *)0x0) {
        local_c8 = (ly_ctx *)0x0;
      }
      else {
        local_c8 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      ly_vlog(local_c8,(char *)0x0,LYVE_SYNTAX_YANG,"Invalid value \"%.*s\" of \"%s\".",10,date,stmt
             );
    }
  }
  else {
    if (ctx == (lysp_ctx *)0x0) {
      local_c0 = (ly_ctx *)0x0;
    }
    else {
      local_c0 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    ly_vlog(local_c0,(char *)0x0,LYVE_SYNTAX_YANG,"Invalid length %u of a date.",
            date_len & 0xffffffff);
  }
  return LY_EINVAL;
}

Assistant:

LY_ERR
lysp_check_date(struct lysp_ctx *ctx, const char *date, size_t date_len, const char *stmt)
{
    struct tm tm, tm_;
    char *r;

    LY_CHECK_ARG_RET(PARSER_CTX(ctx), date, LY_EINVAL);

    if (date_len != LY_REV_SIZE - 1) {
        LOGVAL_PARSER(ctx, LYVE_SYNTAX_YANG, "Invalid length %" PRIu32 " of a date.", (uint32_t)date_len);
        return LY_EINVAL;
    }

    /* check format: YYYY-MM-DD */
    for (uint8_t i = 0; i < date_len; i++) {
        if ((i == 4) || (i == 7)) {
            if (date[i] != '-') {
                goto error;
            }
        } else if (!isdigit(date[i])) {
            goto error;
        }
    }

    /* check content, e.g. 2018-02-31 */
    memset(&tm, 0, sizeof tm);
    r = strptime(date, "%Y-%m-%d", &tm);
    if (!r || (r != &date[LY_REV_SIZE - 1])) {
        goto error;
    }
    memcpy(&tm_, &tm, sizeof tm);

    /* Disabling DST: Set tm_isdst to -1 so that mktime() won't adjust for daylight saving time. */
    tm_.tm_isdst = -1;

    mktime(&tm_); /* mktime modifies tm_ if it refers invalid date */
    if (tm.tm_mday != tm_.tm_mday) { /* e.g 2018-02-29 -> 2018-03-01 */
        /* checking days is enough, since other errors
         * have been checked by strptime() */
        goto error;
    }

    return LY_SUCCESS;

error:
    if (stmt) {
        LOGVAL_PARSER(ctx, LY_VCODE_INVAL, (int)date_len, date, stmt);
    }
    return LY_EINVAL;
}